

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

void __thiscall Js::GlobalObject::Initialize(GlobalObject *this,ScriptContext *scriptContext)

{
  Type *addr;
  Recycler *this_00;
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Recycler *alloc;
  JavascriptLibrary *this_01;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if ((((this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type.ptr)->
      javascriptLibrary).ptr != (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x2f,"(type->javascriptLibrary == nullptr)",
                                "type->javascriptLibrary == nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_00 = scriptContext->recycler;
  local_58 = (undefined1  [8])&JavascriptLibrary::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_665e14c;
  data.filename._0_4_ = 0x31;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_58);
  this_01 = (JavascriptLibrary *)new<Memory::Recycler>(0x1de0,alloc,0x3a2aea);
  JavascriptLibrary::JavascriptLibrary(this_01,this,this_00);
  (scriptContext->super_ScriptContextBase).javascriptLibrary = this_01;
  pTVar1 = (this->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.type.ptr;
  addr = &pTVar1->javascriptLibrary;
  Memory::Recycler::WBSetBit((char *)addr);
  (pTVar1->javascriptLibrary).ptr = this_01;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  ScriptContext::InitializeCache(scriptContext);
  JavascriptLibrary::Initialize(this_01,scriptContext,this);
  Memory::Recycler::WBSetBit((char *)&this->library);
  (this->library).ptr = this_01;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->library);
  return;
}

Assistant:

void GlobalObject::Initialize(ScriptContext * scriptContext)
    {
        Assert(type->javascriptLibrary == nullptr);
        Recycler * recycler = scriptContext->GetRecycler();
        JavascriptLibrary* localLibrary = RecyclerNewFinalized(recycler, JavascriptLibrary, this, recycler);
        scriptContext->SetLibrary(localLibrary);
        type->javascriptLibrary = localLibrary;
        scriptContext->InitializeCache();
        localLibrary->Initialize(scriptContext, this);
        library = localLibrary;
    }